

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O1

UINT32 ByteArrayToUint32(BYTE *a)

{
  uint uVar1;
  
  uVar1 = *(uint *)a;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

UINT32 ByteArrayToUint32(BYTE* a)
{
    UINT32      retVal;
    retVal  = a[0]; retVal <<= 8;
    retVal += a[1]; retVal <<= 8;
    retVal += a[2]; retVal <<= 8;
    retVal += a[3];
    return retVal;
}